

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_stfsu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGTemp *a2;
  TCGTemp *a1;
  uintptr_t o;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i64 EA;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  if ((ctx->opcode & 0x1f0000) != 0) {
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),
                        0x30);
      ctx->access_type = 0x30;
    }
    a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
    EA = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
    a1 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,EA,0);
    tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                      (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
    gen_qemu_st32fs(ctx,(TCGv_i64)((long)a1 - (long)tcg_ctx_00),EA);
    if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != EA) {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,
                        (TCGArg)(cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] +
                                (long)tcg_ctx_00),(TCGArg)a2);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(EA + (long)tcg_ctx_00));
    tcg_temp_free_internal_ppc64
              (tcg_ctx_00,(TCGTemp *)((TCGv_i64)((long)a1 - (long)tcg_ctx_00) + (long)tcg_ctx_00));
    return;
  }
  gen_exception_err(ctx,0x60,0x21);
  return;
}

Assistant:

static void gen_stfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    get_fpr(tcg_ctx, t0, rD(ctx->opcode));
    tcg_gen_qemu_st_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_STORE, DEF_MEMOP(MO_Q));
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}